

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

mi_heap_t * mi_heap_set_default(mi_heap_t *heap)

{
  mi_heap_t *pmVar1;
  long in_FS_OFFSET;
  
  if (heap == &_mi_heap_empty || heap == (mi_heap_t *)0x0) {
    pmVar1 = (mi_heap_t *)0x0;
  }
  else {
    pmVar1 = *(mi_heap_t **)(in_FS_OFFSET + -0x28);
    _mi_heap_set_default_direct(heap);
  }
  return pmVar1;
}

Assistant:

mi_heap_t* mi_heap_set_default(mi_heap_t* heap) {
  mi_assert(heap != NULL);
  mi_assert(mi_heap_is_initialized(heap));
  if (heap==NULL || !mi_heap_is_initialized(heap)) return NULL;
  mi_assert_expensive(mi_heap_is_valid(heap));
  mi_heap_t* old = mi_prim_get_default_heap();
  _mi_heap_set_default_direct(heap);
  return old;
}